

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_fmt.c
# Opt level: O3

void beltFMTStart(void *state,u32 mod,size_t count,octet *key,size_t len)

{
  size_t sVar1;
  ulong count_00;
  
  beltWBLStart(state,key,len);
  *(u32 *)((long)state + 0x48) = mod;
  count_00 = count + 1 >> 1;
  *(ulong *)((long)state + 0x50) = count_00;
  *(size_t *)((long)state + 0x58) = count >> 1;
  sVar1 = beltFMTCalcB(mod,count_00);
  *(size_t *)((long)state + 0x60) = sVar1;
  sVar1 = beltFMTCalcB(mod,*(size_t *)((long)state + 0x58));
  *(size_t *)((long)state + 0x68) = sVar1;
  *(short *)((long)state + 0x70) = (short)mod;
  *(short *)((long)state + 0x72) = (short)count;
  memCopy((void *)((long)state + 0x84),(void *)((long)state + 0x70),4);
  return;
}

Assistant:

void beltFMTStart(void* state, u32 mod, size_t count, const octet key[], 
	size_t len)
{
	belt_fmt_st* st = (belt_fmt_st*)state;
	ASSERT(2 <= mod && mod <= 65536);
	ASSERT(2 <= count && count <= 600);
	ASSERT(memIsValid(state, beltFMT_keep(mod, count)));
	// инициализировать состояние
	beltWBLStart(st->wbl, key, len);
	st->mod = mod;
	st->n1 = (count + 1) / 2;
	st->n2 = count / 2;
	st->b1 = beltFMTCalcB(mod, st->n1);
	st->b2 = beltFMTCalcB(mod, st->n2);
#if (OCTET_ORDER == LITTLE_ENDIAN)
	((u16*)st->iv)[0] = (u16)mod;
	((u16*)st->iv)[1] = (u16)count;
#else
	((u16*)st->iv)[0] = u16Rev((u16)mod);
	((u16*)st->iv)[1] = u16Rev((u16)count);
#endif
	memCopy(st->iv + 20, st->iv, 4);
}